

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc_cord_state.cc
# Opt level: O0

CrcCordState * __thiscall
absl::lts_20250127::crc_internal::CrcCordState::operator=(CrcCordState *this,CrcCordState *other)

{
  CrcCordState *other_local;
  CrcCordState *this_local;
  
  if (this != other) {
    Unref(this->refcounted_rep_);
    this->refcounted_rep_ = other->refcounted_rep_;
    Ref(this->refcounted_rep_);
  }
  return this;
}

Assistant:

CrcCordState& CrcCordState::operator=(const CrcCordState& other) {
  if (this != &other) {
    Unref(refcounted_rep_);
    refcounted_rep_ = other.refcounted_rep_;
    Ref(refcounted_rep_);
  }
  return *this;
}